

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

_Bool do_op3(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b,TCGOpcode opc)

{
  byte bVar1;
  int iVar2;
  uintptr_t o_1;
  uintptr_t o_2;
  
  bVar1 = ((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r];
  iVar2 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc,(uint)bVar1,vece);
  if (iVar2 < 1) {
    if (-1 < iVar2) {
      return false;
    }
    tcg_expand_vec_op_tricore
              (tcg_ctx,opc,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),a + (long)tcg_ctx
               ,b + (long)tcg_ctx);
  }
  else {
    vec_gen_3_tricore(tcg_ctx,opc,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(a + (long)tcg_ctx),(TCGArg)(b + (long)tcg_ctx));
  }
  return true;
}

Assistant:

static bool do_op3(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                   TCGv_vec b, TCGOpcode opc)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_assert_listed_vecop(opc);
    can = tcg_can_emit_vec_op(tcg_ctx, opc, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc, type, vece, ri, ai, bi);
    } else if (can < 0) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_expand_vec_op(tcg_ctx, opc, type, vece, ri, ai, bi);
        tcg_swap_vecop_list(hold_list);
    } else {
        return false;
    }
    return true;
}